

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Molecule.cpp
# Opt level: O0

void __thiscall OpenMD::Molecule::addCutoffGroup(Molecule *this,CutoffGroup *cp)

{
  bool bVar1;
  iterator __last;
  iterator __val;
  iterator __lhs;
  vector<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_> *in_RDI;
  __normal_iterator<OpenMD::CutoffGroup_**,_std::vector<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>_>
  in_stack_ffffffffffffffe8;
  
  __last = std::vector<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>::begin(in_RDI)
  ;
  __val = std::vector<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>::end(in_RDI);
  std::
  find<__gnu_cxx::__normal_iterator<OpenMD::CutoffGroup**,std::vector<OpenMD::CutoffGroup*,std::allocator<OpenMD::CutoffGroup*>>>,OpenMD::CutoffGroup*>
            (in_stack_ffffffffffffffe8,
             (__normal_iterator<OpenMD::CutoffGroup_**,_std::vector<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>_>
              )__last._M_current,__val._M_current);
  __lhs = std::vector<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>::end(in_RDI);
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<OpenMD::CutoffGroup_**,_std::vector<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>_>
                      *)__lhs._M_current,
                     (__normal_iterator<OpenMD::CutoffGroup_**,_std::vector<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>_>
                      *)in_RDI);
  if (bVar1) {
    std::vector<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>::push_back
              ((vector<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_> *)
               __last._M_current,__val._M_current);
  }
  return;
}

Assistant:

void Molecule::addCutoffGroup(CutoffGroup* cp) {
    if (std::find(cutoffGroups_.begin(), cutoffGroups_.end(), cp) ==
        cutoffGroups_.end()) {
      cutoffGroups_.push_back(cp);
    }
  }